

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QRect __thiscall QAccessibleButton::rect(QAccessibleButton *this)

{
  long lVar1;
  QRect QVar2;
  QObject *object;
  QWidget *this_00;
  QStyle *pQVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QRect QVar8;
  undefined8 uStack_d0;
  QRect local_c0;
  QPoint local_b0;
  QStyleOptionButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0xffffffff00000000;
  object = (QObject *)button(this);
  QVar2.x2.m_i = local_c0.x2.m_i;
  QVar2.y2.m_i = local_c0.y2.m_i;
  QVar2.x1.m_i = local_c0.x1.m_i;
  QVar2.y1.m_i = local_c0.y1.m_i;
  if ((*(byte *)(*(long *)(object + 0x20) + 9) & 0x80) == 0) {
    uVar6 = 0;
    QVar7 = (QRect)(ZEXT816(0xffffffff) << 0x40);
    local_c0 = QVar2;
  }
  else {
    this_00 = (QWidget *)QtPrivate::qobject_cast_helper<QCheckBox*,QObject>(object);
    if (this_00 == (QWidget *)0x0) {
      this_00 = (QWidget *)QtPrivate::qobject_cast_helper<QRadioButton*,QObject>(object);
      if (this_00 == (QWidget *)0x0) {
        QVar7 = QAccessibleWidget::rect(&this->super_QAccessibleWidget);
        uVar6 = QVar7._0_8_ & 0xffffffff00000000;
        uVar5 = QVar7._8_8_ & 0xffffffff00000000;
        goto LAB_004d6c6f;
      }
      opt.super_QStyleOption.version = 0;
      opt.super_QStyleOption.type = 0;
      local_b0 = QWidget::mapToGlobal(this_00,(QPoint *)&opt);
      opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionButton::QStyleOptionButton(&opt);
      (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&opt);
      pQVar3 = QWidget::style(this_00);
      lVar4 = *(long *)pQVar3;
      uStack_d0 = 9;
    }
    else {
      opt.super_QStyleOption.version = 0;
      opt.super_QStyleOption.type = 0;
      local_b0 = QWidget::mapToGlobal(this_00,(QPoint *)&opt);
      opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionButton::QStyleOptionButton(&opt);
      (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&opt);
      pQVar3 = QWidget::style(this_00);
      lVar4 = *(long *)pQVar3;
      uStack_d0 = 5;
    }
    local_c0 = (QRect)(**(code **)(lVar4 + 0xc0))(pQVar3,uStack_d0,&opt,this_00);
    QVar7 = QRect::translated(&local_c0,&local_b0);
    uVar6 = QVar7._0_8_ & 0xffffffff00000000;
    uVar5 = QVar7._8_8_ & 0xffffffff00000000;
    QStyleOptionButton::~QStyleOptionButton(&opt);
  }
LAB_004d6c6f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar8._0_8_ = QVar7._0_8_ & 0xffffffff | uVar6;
    QVar8._8_8_ = QVar7._8_8_ & 0xffffffff | uVar5;
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleButton::rect() const
{
    QAbstractButton *ab = button();
    if (!ab->isVisible())
        return QRect();

#if QT_CONFIG(checkbox)
    if (QCheckBox *cb = qobject_cast<QCheckBox *>(ab)) {
        QPoint wpos = cb->mapToGlobal(QPoint(0, 0));
        QStyleOptionButton opt;
        cb->initStyleOption(&opt);
        return cb->style()->subElementRect(QStyle::SE_CheckBoxClickRect, &opt, cb).translated(wpos);
    }
#endif
#if QT_CONFIG(radiobutton)
    else if (QRadioButton *rb = qobject_cast<QRadioButton *>(ab)) {
        QPoint wpos = rb->mapToGlobal(QPoint(0, 0));
        QStyleOptionButton opt;
        rb->initStyleOption(&opt);
        return rb->style()->subElementRect(QStyle::SE_RadioButtonClickRect, &opt, rb).translated(wpos);
    }
#endif
    return QAccessibleWidget::rect();
}